

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall
JsonObject_DuplicateKeys_Test::JsonObject_DuplicateKeys_Test(JsonObject_DuplicateKeys_Test *this)

{
  JsonObject_DuplicateKeys_Test *this_local;
  
  anon_unknown.dwarf_10761d::JsonObject::JsonObject(&this->super_JsonObject);
  (this->super_JsonObject).super_Test._vptr_Test =
       (_func_int **)&PTR__JsonObject_DuplicateKeys_Test_0025b318;
  return;
}

Assistant:

TEST_F (JsonObject, DuplicateKeys) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_object ()).Times (1);
        EXPECT_CALL (callbacks_, key ("a")).Times (1);
        EXPECT_CALL (callbacks_, uint64_value (1)).Times (1);
        EXPECT_CALL (callbacks_, key ("a")).Times (1);
        EXPECT_CALL (callbacks_, boolean_value (true)).Times (1);
        EXPECT_CALL (callbacks_, end_object ()).Times (1);
    }
    auto p = json::make_parser (proxy_);
    p.input (std::string{"{\"a\":1, \"a\" : true }"});
    p.eof ();
    EXPECT_FALSE (p.has_error ());
}